

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

void __thiscall PcodeOp::saveXml(PcodeOp *this,ostream *s)

{
  spacetype sVar1;
  pointer ppVVar2;
  Varnode *pVVar3;
  uintb uVar4;
  ostream *poVar5;
  int4 i;
  ulong uVar6;
  char *pcVar7;
  allocator local_51;
  string local_50;
  
  std::operator<<(s,"<op");
  std::__cxx11::string::string((string *)&local_50,"code",&local_51);
  a_v_i(s,&local_50,(long)(int)this->opcode->opcode);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<(s,">\n");
  SeqNum::saveXml(&this->start,s);
  std::operator<<(s,'\n');
  if (this->output == (Varnode *)0x0) {
    pcVar7 = "<void/>\n";
    poVar5 = s;
  }
  else {
    poVar5 = std::operator<<(s,"<addr ref=\"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    pcVar7 = "\"/>\n";
  }
  std::operator<<(poVar5,pcVar7);
  uVar6 = 0;
  do {
    ppVVar2 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2 >> 3) <= uVar6) {
      std::operator<<(s,"</op>\n");
      return;
    }
    pVVar3 = ppVVar2[uVar6];
    if (pVVar3 == (Varnode *)0x0) {
LAB_002a85cf:
      pcVar7 = "<void/>\n";
      poVar5 = s;
LAB_002a864a:
      std::operator<<(poVar5,pcVar7);
    }
    else {
      sVar1 = ((pVVar3->loc).base)->type;
      if (sVar1 == IPTR_CONSTANT) {
        if ((uVar6 != 0) || ((this->opcode->opcode & ~CPUI_COPY) != CPUI_LOAD)) goto LAB_002a860f;
        uVar4 = (pVVar3->loc).offset;
        std::operator<<(s,"<spaceid name=\"");
        poVar5 = std::operator<<(s,(string *)(uVar4 + 0x38));
LAB_002a8640:
        pcVar7 = "\"/>\n";
        goto LAB_002a864a;
      }
      if (sVar1 != IPTR_IOP) {
LAB_002a860f:
        poVar5 = std::operator<<(s,"<addr ref=\"0x");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        goto LAB_002a8640;
      }
      if ((uVar6 != 1) || (this->opcode->opcode != CPUI_INDIRECT)) goto LAB_002a85cf;
      uVar4 = (pVVar3->loc).offset;
      std::operator<<(s,"<iop");
      std::__cxx11::string::string((string *)&local_50,"value",&local_51);
      a_v_u(s,&local_50,(ulong)*(uint *)(uVar4 + 0x20));
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<(s,"/>\n");
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void PcodeOp::saveXml(ostream &s) const

{
  s << "<op";
  a_v_i(s,"code",(int4)code());
  s << ">\n";
  start.saveXml(s);
  s << '\n';
  if (output==(Varnode *)0)
    s << "<void/>\n";
  else
    s << "<addr ref=\"0x" << hex << output->getCreateIndex() << "\"/>\n";
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn = getIn(i);
    if (vn == (const Varnode *)0)
      s << "<void/>\n";
    else if (vn->getSpace()->getType()==IPTR_IOP) {
      if ((i==1)&&(code()==CPUI_INDIRECT)) {
	PcodeOp *indop = PcodeOp::getOpFromConst(vn->getAddr());
	s << "<iop";
	a_v_u(s,"value",indop->getSeqNum().getTime());
	s << "/>\n";
      }
      else
	s << "<void/>\n";
    }
    else if (vn->getSpace()->getType()==IPTR_CONSTANT) {
      if ((i==0)&&((code()==CPUI_STORE)||(code()==CPUI_LOAD))) {
	AddrSpace *spc = Address::getSpaceFromConst(vn->getAddr());
	s << "<spaceid name=\"";
	s << spc->getName() << "\"/>\n";
      }
      else
	s << "<addr ref=\"0x" << hex << vn->getCreateIndex() << "\"/>\n";
    }
    else {
      s << "<addr ref=\"0x" << hex << vn->getCreateIndex() << "\"/>\n";
    }
  }
  s << "</op>\n";
}